

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O3

void puppup::board::print(State *state,State *other)

{
  long lVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  idx i;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  array<long,_256UL> *paVar8;
  array<long,_256UL> *paVar9;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Score: ",7);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar9 = &state->board;
  paVar8 = &other->board;
  lVar6 = 0;
  lVar4 = 0;
  do {
    uStack_38._0_4_ = CONCAT13("ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar4],(undefined3)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_38 + 3),1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar7 = 0;
    do {
      lVar3 = *(long *)((long)paVar9->_M_elems + lVar7);
      if (lVar3 == 0x1b) {
        lVar3 = *(long *)((long)&letter_multiplier + lVar6 + lVar7);
        if (lVar3 == 3) {
          lVar3 = 0xf;
          poVar2 = (ostream *)&std::cout;
          pcVar5 = "\x1b[1;104m + \x1b[0m";
        }
        else if (lVar3 == 2) {
          lVar3 = 0xe;
          pcVar5 = "\x1b[1;46m + \x1b[0m";
          poVar2 = (ostream *)&std::cout;
        }
        else {
          lVar3 = *(long *)((long)&word_multiplier + lVar6 + lVar7);
          if (lVar3 == 3) {
            lVar3 = 0xe;
            poVar2 = (ostream *)&std::cout;
            pcVar5 = "\x1b[1;41m + \x1b[0m";
          }
          else if (lVar3 == 2) {
            lVar3 = 0xe;
            pcVar5 = "\x1b[1;45m + \x1b[0m";
            poVar2 = (ostream *)&std::cout;
          }
          else {
            lVar3 = 0xc;
            pcVar5 = "\x1b[47m   \x1b[0m";
            poVar2 = (ostream *)&std::cout;
          }
        }
      }
      else {
        lVar1 = *(long *)((long)paVar9[1]._M_elems + lVar7);
        if (lVar3 == *(long *)((long)paVar8->_M_elems + lVar7)) {
          if (lVar1 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[1;103;31m ",0xc);
            pcVar5 = (char *)((long)&uStack_38 + 4);
            uStack_38._0_5_ =
                 CONCAT14("EIAONTRSULDGYWVPMHFCBZXQKJ_    +"
                          [*(long *)((long)paVar9->_M_elems + lVar7)],(undefined4)uStack_38);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[1;103;30m ",0xc);
            pcVar5 = (char *)((long)&uStack_38 + 5);
            uStack_38._0_6_ =
                 CONCAT15("EIAONTRSULDGYWVPMHFCBZXQKJ_    +"
                          [*(long *)((long)paVar9->_M_elems + lVar7)],(undefined5)uStack_38);
          }
        }
        else if (lVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\x1b[1;33;31m ",0xb);
          pcVar5 = (char *)((long)&uStack_38 + 6);
          uStack_38._0_7_ =
               CONCAT16("EIAONTRSULDGYWVPMHFCBZXQKJ_    +"
                        [*(long *)((long)paVar9->_M_elems + lVar7)],(undefined6)uStack_38);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\x1b[1;37;40m ",0xb);
          pcVar5 = (char *)((long)&uStack_38 + 7);
          uStack_38 = CONCAT17("EIAONTRSULDGYWVPMHFCBZXQKJ_    +"
                               [*(long *)((long)paVar9->_M_elems + lVar7)],(undefined7)uStack_38);
        }
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,1);
        lVar3 = 5;
        pcVar5 = " \x1b[0m";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar3);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x80;
    paVar9 = (array<long,_256UL> *)(paVar9->_M_elems + 0x10);
    paVar8 = (array<long,_256UL> *)(paVar8->_M_elems + 0x10);
  } while (lVar4 != 0xf);
  lVar4 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  do {
    lVar6 = *(long *)(std::cout + -0x18);
    if (*(char *)(lVar6 + 0x1131f1) == '\0') {
      std::ios::widen((char)lVar6 + '\x10');
      *(undefined1 *)(lVar6 + 0x1131f1) = 1;
    }
    lVar7 = std::cout;
    *(undefined1 *)(lVar6 + 0x1131f0) = 0x20;
    *(undefined8 *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar7 + -0x18))
         = 3;
    std::ostream::_M_insert<long>((long)&std::cout);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

inline void print(const State& state, const State& other) {
    std::cout << "Score: " << state.score << std::endl;
    for (idx i = board_min; i <= board_max; ++i) {
        std::cout << ABC[i - board_min] << " ";
        for (idx j = board_min; j <= board_max; ++j) {
            if (state.board[i * 16 + j] != emptiness) {
                if (state.board[i * 16 + j] == other.board[i * 16 + j]) {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;103;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;103;30m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                } else {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;33;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;37;40m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                }
            } else {
                if (letter_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;46m + \033[0m";
                } else if (letter_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;104m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;45m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;41m + \033[0m";
                } else {
                    std::cout << "\033[47m   \33[0m";
                }
            }
        }
        std::cout << "\n";
    }
    std::cout << " ";
    for (idx j = board_min; j <= board_max; ++j) {
        std::cout << std::setfill(' ') << std::setw(3) << j + 1 - board_min;
    }
    std::cout << std::endl;
}